

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::BuildLiveFieldSets(CrateReader *this)

{
  pointer pFVar1;
  mapped_type *pmVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  Index *pIVar6;
  ulong uVar7;
  bool bVar8;
  optional<tinyusdz::Token> tokv;
  ostringstream ss_e;
  bool local_211;
  Index *local_210;
  string local_208;
  string *local_1e8;
  optional<tinyusdz::Token> local_1e0;
  map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  *local_1b8;
  mapped_type *local_1b0;
  key_type local_1a8 [28];
  ios_base local_138 [264];
  
  pIVar6 = (this->_fieldset_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1a8[0].value = 0xffffffff;
  local_210 = (Index *)::std::
                       __find_if<__gnu_cxx::__normal_iterator<tinyusdz::crate::Index*,std::vector<tinyusdz::crate::Index,std::allocator<tinyusdz::crate::Index>>>,__gnu_cxx::__ops::_Iter_equals_val<tinyusdz::crate::Index_const>>
                                 (pIVar6,(this->_fieldset_indices).
                                         super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
  local_211 = pIVar6 == (this->_fieldset_indices).
                        super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  if (!local_211) {
    local_1b8 = &this->_live_fieldsets;
    local_1e8 = &this->_err;
    do {
      local_1a8[0].value =
           (uint32_t)
           ((ulong)((long)pIVar6 -
                   (long)(this->_fieldset_indices).
                         super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2);
      local_1b0 = ::std::
                  map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
                  ::operator[](local_1b8,local_1a8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
      ::resize(local_1b0,(long)local_210 - (long)pIVar6 >> 2);
      bVar8 = local_210 == pIVar6;
      if (!bVar8) {
        lVar5 = 0;
        do {
          uVar7 = (ulong)pIVar6->value;
          pFVar1 = (this->_fields).
                   super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_fields).
                            super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4) <= uVar7
             ) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"BuildLiveFieldSets",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1715);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid live field set data.",0x1c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append
                      ((char *)local_1e8,CONCAT71(local_1e0._1_7_,local_1e0.has_value_));
            if ((void *)CONCAT71(local_1e0._1_7_,local_1e0.has_value_) !=
                (void *)((long)&local_1e0.contained + 8)) {
              operator_delete((void *)CONCAT71(local_1e0._1_7_,local_1e0.has_value_),
                              local_1e0.contained._8_8_ + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
LAB_001dd8d6:
            if (!bVar8) {
              return local_211;
            }
            break;
          }
          GetToken(&local_1e0,this,(Index)pFVar1[uVar7].token_index.super_Index.value);
          pmVar2 = local_1b0;
          if (local_1e0.has_value_ == true) {
            ::std::__cxx11::string::_M_assign
                      ((string *)
                       ((long)&(((local_1b0->
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                               _M_p + lVar5));
            bVar3 = UnpackValueRep(this,&pFVar1[uVar7].value_rep,
                                   (CrateValue *)
                                   ((long)&(((pmVar2->
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->second).
                                           value_.v_ + lVar5));
            if (!bVar3) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"BuildLiveFieldSets",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1720);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"BuildLiveFieldSets: Failed to unpack ValueRep : ",
                         0x30);
              ValueRep::GetStringRepr_abi_cxx11_(&local_208,&pFVar1[uVar7].value_rep);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                                  local_208._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)local_1e8,(ulong)local_208._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              if ((local_1e0.has_value_ == true) &&
                 (local_1e0.contained.data.__align !=
                  (anon_struct_8_0_00000001_for___align)((long)&local_1e0.contained + 0x10))) {
                operator_delete((void *)local_1e0.contained.data._0_8_,
                                local_1e0.contained._16_8_ + 1);
              }
              goto LAB_001dd8d6;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"BuildLiveFieldSets",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1724);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid token index.",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)local_1e8,(ulong)local_208._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
          }
          if ((local_1e0.has_value_ == true) &&
             (local_1e0.contained.data.__align !=
              (anon_struct_8_0_00000001_for___align)((long)&local_1e0.contained + 0x10))) {
            operator_delete((void *)local_1e0.contained.data._0_8_,local_1e0.contained._16_8_ + 1);
          }
          pIVar6 = pIVar6 + 1;
          lVar5 = lVar5 + 0x38;
          bVar8 = pIVar6 == local_210;
        } while (!bVar8);
      }
      pIVar6 = local_210 + 1;
      local_1a8[0].value = 0xffffffff;
      local_210 = (Index *)::std::
                           __find_if<__gnu_cxx::__normal_iterator<tinyusdz::crate::Index*,std::vector<tinyusdz::crate::Index,std::allocator<tinyusdz::crate::Index>>>,__gnu_cxx::__ops::_Iter_equals_val<tinyusdz::crate::Index_const>>
                                     (pIVar6,(this->_fieldset_indices).
                                             super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,local_1a8);
      local_211 = pIVar6 == (this->_fieldset_indices).
                            super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
    } while (!local_211);
  }
  return local_211;
}

Assistant:

bool CrateReader::BuildLiveFieldSets() {
  for (auto fsBegin = _fieldset_indices.begin(),
            fsEnd = std::find(fsBegin, _fieldset_indices.end(), crate::Index());
       fsBegin != _fieldset_indices.end();
       fsBegin = fsEnd + 1, fsEnd = std::find(fsBegin, _fieldset_indices.end(),
                                              crate::Index())) {
    auto &pairs = _live_fieldsets[crate::Index(
        uint32_t(fsBegin - _fieldset_indices.begin()))];

    pairs.resize(size_t(fsEnd - fsBegin));
    DCOUT("range size = " << (fsEnd - fsBegin));
    // TODO(syoyo): Parallelize.
    for (size_t i = 0; fsBegin != fsEnd; ++fsBegin, ++i) {
      if (fsBegin->value < _fields.size()) {
        // ok
      } else {
        PUSH_ERROR("Invalid live field set data.");
        return false;
      }

      DCOUT("fieldIndex = " << (fsBegin->value));
      auto const &field = _fields[fsBegin->value];
      if (auto tokv = GetToken(field.token_index)) {
        pairs[i].first = tokv.value().str();

        if (!UnpackValueRep(field.value_rep, &pairs[i].second)) {
          PUSH_ERROR("BuildLiveFieldSets: Failed to unpack ValueRep : "
                     << field.value_rep.GetStringRepr());
          return false;
        }
      } else {
        PUSH_ERROR("Invalid token index.");
      }
    }
  }

  DCOUT("# of live fieldsets = " << _live_fieldsets.size());

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  size_t sum = 0;
  for (const auto &item : _live_fieldsets) {
    DCOUT("livefieldsets[" << item.first.value
                           << "].count = " << item.second.size());
    sum += item.second.size();

    for (size_t i = 0; i < item.second.size(); i++) {
      DCOUT(" [" << i << "] name = " << item.second[i].first);
    }
  }
  DCOUT("Total fields used = " << sum);
#endif

  return true;
}